

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

double loguru::log(double __x)

{
  char in_AL;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  Verbosity in_EDI;
  double extraout_XMM0_Qa;
  Text buff;
  va_list vlist;
  undefined1 local_d8 [48];
  double local_a8;
  
  vlist[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = __x;
  }
  vlist[0].overflow_arg_area = &stack0x00000008;
  vlist[0].gp_offset = 0x20;
  vlist[0].fp_offset = 0x30;
  vtextprintf((loguru *)&buff,in_RCX,vlist);
  log_to_everywhere(1,in_EDI,in_RSI,in_EDX,"",buff._str);
  free(buff._str);
  return extraout_XMM0_Qa;
}

Assistant:

void log(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
	{
		va_list vlist;
		va_start(vlist, format);
		auto buff = vtextprintf(format, vlist);
		log_to_everywhere(1, verbosity, file, line, "", buff.c_str());
		va_end(vlist);
	}